

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RasterizerState.h
# Opt level: O0

void __thiscall Diligent::RasterizerStateDesc::RasterizerStateDesc(RasterizerStateDesc *this)

{
  RasterizerStateDesc *this_local;
  
  this->FillMode = FILL_MODE_SOLID;
  this->CullMode = CULL_MODE_BACK;
  this->FrontCounterClockwise = false;
  this->DepthClipEnable = true;
  this->ScissorEnable = false;
  this->AntialiasedLineEnable = false;
  this->DepthBias = 0;
  this->DepthBiasClamp = 0.0;
  this->SlopeScaledDepthBias = 0.0;
  return;
}

Assistant:

constexpr RasterizerStateDesc() noexcept {}